

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O3

void fast_test(void)

{
  PtTimestamp PVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  PortMidiStream *midi;
  char line [80];
  PortMidiStream *local_a0;
  int local_94;
  ulong local_90;
  char local_88 [88];
  
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  Pm_OpenOutput(&local_a0,deviceno,(void *)0x0,0,Pt_Time,(void *)0x0,latency);
  printf("Midi Output opened with %ld ms latency.\n",(long)latency);
  PVar1 = Pt_Time();
  iVar4 = PVar1 + 1000;
  while( true ) {
    PVar1 = Pt_Time();
    if (iVar4 <= PVar1) break;
    usleep(10000);
  }
  puts("sending output...");
  fflush(_stdout);
  PVar1 = Pt_Time();
  iVar6 = latency * 2;
  if (expired_timestamps == 0) {
    iVar6 = 0;
  }
  PVar1 = PVar1 - iVar6;
  uVar3 = PVar1 - iVar4;
  if (SBORROW4(uVar3,duration * 1000) != (int)(uVar3 + duration * -1000) < 0) {
    uVar2 = 0x3c;
    iVar6 = 1000;
    uVar7 = 0;
    local_94 = iVar4;
    do {
      uVar5 = (int)(msgrate * uVar3) / 1000;
      local_90 = (ulong)uVar5;
      if ((int)uVar7 < (int)uVar5) {
        do {
          uVar5 = (uVar2 & 0xff) * 0x100;
          Pm_WriteShort(local_a0,PVar1,uVar5 + 0x640090);
          Pm_WriteShort(local_a0,PVar1,uVar5 | 0x90);
          uVar7 = uVar7 + 2;
          if (iVar6 <= (int)uVar3) {
            printf("%d at %dms\n",(ulong)uVar7,(ulong)uVar3);
            fflush(_stdout);
            iVar6 = iVar6 + 1000;
          }
          iVar4 = (int)(uVar2 - 0x3b) >> 0x1f;
          uVar2 = uVar2 + (((uint)((int)(uVar2 - 0x3b) / 6 + iVar4) >> 1) - iVar4) * -0xc + 1;
        } while ((int)uVar7 < (int)local_90);
      }
      PVar1 = Pt_Time();
      uVar3 = PVar1 - local_94;
    } while (SBORROW4(uVar3,duration * 1000) != (int)(uVar3 + duration * -1000) < 0);
  }
  printf("ready to close and terminate... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  Pm_Close(local_a0);
  Pm_Terminate();
  puts("done closing and terminating...");
  return;
}

Assistant:

void fast_test()
{
    PmStream * midi;
	char line[80];

    /* It is recommended to start timer before PortMidi */
    TIME_START;

	/* open output device */
    Pm_OpenOutput(&midi, 
                  deviceno, 
                  DRIVER_INFO,
                  OUTPUT_BUFFER_SIZE, 
                  (int32_t (*)(void *)) Pt_Time,
                  NULL,
                  latency);
    printf("Midi Output opened with %ld ms latency.\n", (long) latency);

    /* wait a sec after printing previous line */
    PmTimestamp start = Pt_Time() + 1000;
    while (start > Pt_Time()) {
        Sleep(10);
    }
    printf("sending output...\n");
    fflush(stdout); /* make sure message goes to console */

    /* every 10ms send on/off pairs at timestamps set to current time */
    PmTimestamp now = Pt_Time();
    int msgcnt = 0;
    int pitch = 60;
    int printtime = 1000;
    /* if expired_timestamps, we want to send timestamps that have
     * expired. They should be sent immediately, but there's a suggestion
     * that negative delay might cause problems in the ALSA implementation
     * so this is something we can test using the -n flag.
     */
    if (expired_timestamps) {
        now = now - 2 * latency;
    }
    while (now - start < duration *  1000) {
        /* how many messages do we send? Total should be
         *     (elapsed * rate) / 1000
         */
        int send_total = ((now - start) * msgrate) / 1000;
        while (msgcnt < send_total) {
            Pm_WriteShort(midi, now, Pm_Message(0x90, pitch, 100));
            Pm_WriteShort(midi, now, Pm_Message(0x90, pitch, 0));
            msgcnt += 2;
            /* play 60, 61, 62, ... 71, then wrap back to 60, 61, ... */
            pitch = (pitch - 59) % 12 + 60;
            if (now - start >= printtime) {
                printf("%d at %dms\n", msgcnt, now - start);
                fflush(stdout); /* make sure message goes to console */
                printtime += 1000; /* next msg in 1s */
            }
        }
        now = Pt_Time();
    }
    /* close device (this not explicitly needed in most implementations) */
    printf("ready to close and terminate... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
	
    Pm_Close(midi);
    Pm_Terminate();
    printf("done closing and terminating...\n");
}